

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::sendMouseEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *this_01;
  MouseButton MVar1;
  bool bVar2;
  MouseButton MVar3;
  QFlagsStorage<Qt::MouseButton> QVar4;
  QWidget *viewport;
  long lVar5;
  qreal *pqVar6;
  QPointF *pQVar7;
  int i;
  long in_FS_OFFSET;
  byte bVar8;
  qreal qVar9;
  QPointF QVar10;
  MouseButton button;
  QTransform mapFromScene;
  QPointF local_c0;
  MouseButton local_ac;
  QPointF local_a8;
  QPointF local_98;
  QPointF local_88 [5];
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar3 = QGraphicsSceneMouseEvent::button(mouseEvent);
  if (MVar3 == NoButton) {
    QVar4.i = (Int)QGraphicsSceneMouseEvent::buttons(mouseEvent);
    if (((QFlagsStorage<Qt::MouseButton>)QVar4.i == (QFlagsStorage<Qt::MouseButton>)0x0) &&
       ((this->field_0xb9 & 8) != 0)) {
      if ((this->mouseGrabberItems).d.size != 0) {
        QGraphicsItem::ungrabMouse(*(this->mouseGrabberItems).d.ptr);
      }
      this->lastMouseGrabberItem = (QGraphicsItem *)0x0;
      goto LAB_0061080c;
    }
  }
  this_00 = (this->mouseGrabberItems).d.ptr[(this->mouseGrabberItems).d.size + -1];
  bVar2 = QGraphicsItem::isBlockedByModalPanel(this_00,(QGraphicsItem **)0x0);
  if (!bVar2) {
    pqVar6 = (qreal *)&DAT_00702c58;
    pQVar7 = local_88;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar7->xp = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar8 * -2 + 1;
      pQVar7 = (QPointF *)&pQVar7[-(ulong)bVar8].yp;
    }
    this_01 = (this_00->d_ptr).d;
    viewport = QGraphicsSceneEvent::widget(&mouseEvent->super_QGraphicsSceneEvent);
    QGraphicsItemPrivate::genericMapFromSceneTransform((QTransform *)local_88,this_01,viewport);
    local_98.xp = -NAN;
    local_98.yp = -NAN;
    QVar10 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
    qVar9 = QVar10.yp;
    local_a8.xp = QVar10.xp;
    local_a8.yp = qVar9;
    local_98.xp = (qreal)QTransform::map(local_88);
    MVar3 = LeftButton;
    local_98.yp = qVar9;
    do {
      local_ac = MVar3;
      QVar10 = QMap<Qt::MouseButton,_QPointF>::value
                         (&this->mouseGrabberButtonDownPos,&local_ac,&local_98);
      local_a8.yp = QVar10.yp;
      local_a8.xp = QVar10.xp;
      QGraphicsSceneMouseEvent::setButtonDownPos(mouseEvent,MVar3,&local_a8);
      MVar1 = local_ac;
      QVar10 = QGraphicsSceneMouseEvent::scenePos(mouseEvent);
      local_c0.yp = QVar10.yp;
      local_c0.xp = QVar10.xp;
      QVar10 = QMap<Qt::MouseButton,_QPointF>::value
                         (&this->mouseGrabberButtonDownScenePos,&local_ac,&local_c0);
      local_a8.yp = QVar10.yp;
      local_a8.xp = QVar10.xp;
      QGraphicsSceneMouseEvent::setButtonDownScenePos(mouseEvent,MVar1,&local_a8);
      MVar1 = local_ac;
      local_c0.xp = (qreal)QGraphicsSceneMouseEvent::screenPos(mouseEvent);
      local_a8.xp = (qreal)QMap<Qt::MouseButton,_QPoint>::value
                                     (&this->mouseGrabberButtonDownScreenPos,&local_ac,
                                      (QPoint *)&local_c0);
      QGraphicsSceneMouseEvent::setButtonDownScreenPos(mouseEvent,MVar1,(QPoint *)&local_a8);
      MVar3 = MVar3 * 2;
    } while ((int)MVar3 < 0x11);
    QGraphicsSceneMouseEvent::setPos(mouseEvent,&local_98);
    QVar10 = QGraphicsSceneMouseEvent::lastScenePos(mouseEvent);
    qVar9 = QVar10.yp;
    local_c0.xp = QVar10.xp;
    local_c0.yp = qVar9;
    local_a8.xp = (qreal)QTransform::map(local_88);
    local_a8.yp = qVar9;
    QGraphicsSceneMouseEvent::setLastPos(mouseEvent,&local_a8);
    sendEvent(this,this_00,(QEvent *)mouseEvent);
  }
LAB_0061080c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::sendMouseEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    if (mouseEvent->button() == 0 && mouseEvent->buttons() == 0 && lastMouseGrabberItemHasImplicitMouseGrab) {
        // ### This is a temporary fix for until we get proper mouse
        // grab events.
        clearMouseGrabber();
        return;
    }

    QGraphicsItem *item = mouseGrabberItems.constLast();
    if (item->isBlockedByModalPanel())
        return;

    const QTransform mapFromScene = item->d_ptr->genericMapFromSceneTransform(mouseEvent->widget());
    const QPointF itemPos = mapFromScene.map(mouseEvent->scenePos());
    for (int i = 0x1; i <= 0x10; i <<= 1) {
        Qt::MouseButton button = Qt::MouseButton(i);
        mouseEvent->setButtonDownPos(button, mouseGrabberButtonDownPos.value(button, itemPos));
        mouseEvent->setButtonDownScenePos(button, mouseGrabberButtonDownScenePos.value(button, mouseEvent->scenePos()));
        mouseEvent->setButtonDownScreenPos(button, mouseGrabberButtonDownScreenPos.value(button, mouseEvent->screenPos()));
    }
    mouseEvent->setPos(itemPos);
    mouseEvent->setLastPos(mapFromScene.map(mouseEvent->lastScenePos()));
    sendEvent(item, mouseEvent);
}